

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconmor.cpp
# Opt level: O2

void __thiscall CVmConsole::show_con_more_prompt(CVmConsole *this)

{
  bool bVar1;
  int iVar2;
  int unaff_EBP;
  os_event_info_t evt;
  
  (*this->disp_str_->_vptr_CVmFormatter[8])();
  (*this->disp_str_->_vptr_CVmFormatter[9])();
  bVar1 = false;
LAB_00268d9e:
  if (bVar1) {
    (*this->disp_str_->_vptr_CVmFormatter[8])(this->disp_str_,"\r      \r");
    if (unaff_EBP != 0) {
      (*this->disp_str_->_vptr_CVmFormatter[2])(this->disp_str_,0);
    }
    return;
  }
  bVar1 = false;
  iVar2 = os_get_event(0,0,&evt);
  if (iVar2 != 5) goto code_r0x00268db7;
  G_os_moremode = 0;
  goto LAB_00268ddc;
code_r0x00268db7:
  if (iVar2 == 1) {
    if (((evt.key[0] == 10) || (evt.key[0] == 0xd)) || (evt.key[0] == 0x2028)) {
      unaff_EBP = 0;
      bVar1 = true;
    }
    else if (evt.key[0] == 0x20) {
LAB_00268ddc:
      unaff_EBP = 1;
      bVar1 = true;
    }
  }
  goto LAB_00268d9e;
}

Assistant:

void CVmConsole::show_con_more_prompt(VMG0_)
{
    int done;
    int next_page;

    /* display the "MORE" prompt */
    disp_str_->print_to_os("[More]");
    disp_str_->flush_to_os();

    /* wait for an acceptable keystroke */
    for (done = FALSE ; !done ; )
    {
        os_event_info_t evt;

        /* get an event */
        switch(os_get_event(0, FALSE, &evt))
        {
        case OS_EVT_KEY:
            switch(evt.key[0])
            {
            case ' ':
                /* stop waiting, show one page */
                done = TRUE;
                next_page = TRUE;
                break;

            case '\r':
            case '\n':
            case 0x2028:                /* unicode line separator character */
                /* stop waiting, show one line */
                done = TRUE;
                next_page = FALSE;
                break;

            default:
                /* ignore any other keystrokes */
                break;
            }
            break;

        case OS_EVT_EOF:
            /* end of file - there's nothing to wait for now */
            done = TRUE;
            next_page = TRUE;

            /* stop showing [more] prompts, as the user can't respond */
            G_os_moremode = FALSE;
            break;

        default:
            /* ignore other events */
            break;
        }
    }

    /* 
     *   Remove the prompt from the screen by backing up and overwriting
     *   it with spaces.  (Note that this assumes that we're running in
     *   some kind of terminal or character mode with a fixed-pitch font;
     *   if that's not the case, the OS layer should be taking
     *   responsibility for pagination anyway, so this code shouldn't be
     *   in use in the first place.)  
     */
    disp_str_->print_to_os( "\r      \r" );

    /* 
     *   if they pressed the space key, it means that we should show an
     *   entire new page, so reset the line count to zero; otherwise,
     *   we'll want to display another MORE prompt at the very next line,
     *   so leave the line count alone 
     */
    if (next_page)
        disp_str_->reset_line_count(FALSE);
}